

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Version.cpp
# Opt level: O0

string * __thiscall
llbuild::getLLBuildFullVersion_abi_cxx11_
          (string *__return_storage_ptr__,llbuild *this,StringRef productName)

{
  string local_48;
  undefined1 local_21;
  undefined1 local_20 [8];
  StringRef productName_local;
  string *result;
  
  productName_local.Data = productName.Data;
  local_21 = 0;
  local_20 = (undefined1  [8])this;
  productName_local.Length = (size_t)__return_storage_ptr__;
  llvm::StringRef::str_abi_cxx11_(&local_48,(StringRef *)local_20);
  std::operator+(__return_storage_ptr__,&local_48," version 5.2");
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string getLLBuildFullVersion(StringRef productName) {
  std::string result = productName.str() + " version 5.2";

  // Include the additional build version information, if present.
#ifdef LLBUILD_VENDOR_STRING
  result = std::string(LLBUILD_VENDOR_STRING) + " " + result;
#endif
#ifdef LLBUILD_VERSION_STRING
  result = result + " (" + std::string(LLBUILD_VERSION_STRING) + ")";
#endif

  return result;
}